

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

djg_mesh * djgm_load_plane(int slices,int stacks)

{
  uint uVar1;
  short sVar2;
  uint uVar3;
  djg_mesh *__ptr;
  djgm_vertex *pdVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  int iVar7;
  uint uVar8;
  short sVar9;
  uint uVar10;
  uint uVar11;
  uint16_t uVar12;
  ulong uVar13;
  ulong uVar14;
  djgm_vertex *pdVar15;
  short sVar16;
  djgm_vertex *pdVar17;
  ulong uVar18;
  ulong uVar19;
  short *psVar20;
  ulong uVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  
  __ptr = (djg_mesh *)malloc(0x28);
  if (__ptr == (djg_mesh *)0x0) {
    __assert_fail("mesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                  ,0x5fc,"djg_mesh *djgm__create()");
  }
  __ptr->poly4v = (uint16_t *)0x0;
  __ptr->vertexc = 0;
  __ptr->poly3c = 0;
  __ptr->vertexv = (djgm_vertex *)0x0;
  __ptr->poly3v = (uint16_t *)0x0;
  __ptr->poly4c = 0;
  if ((stacks | slices) < 0) {
    __assert_fail("slices >= 0 && stacks >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                  ,0x674,"djg_mesh *djgm_load_plane(int, int)");
  }
  uVar1 = stacks + 2;
  uVar10 = uVar1 * (slices + 2U);
  if ((int)uVar10 < 0x10000) {
    pdVar4 = (djgm_vertex *)malloc((ulong)uVar10 << 6);
    if (slices < -1) {
      __ptr->vertexv = pdVar4;
      __ptr->vertexc = uVar10;
    }
    else {
      uVar13 = 0;
      pdVar15 = pdVar4;
      do {
        if (-2 < stacks) {
          fVar23 = (float)(int)uVar13 / (float)(slices + 1);
          uVar19 = 0;
          pdVar17 = pdVar15;
          do {
            (pdVar17->st).s = fVar23;
            fVar24 = (float)(int)uVar19 / (float)(stacks + 1);
            (pdVar17->st).t = fVar24;
            (pdVar17->st).p = 0.0;
            (pdVar17->st).q = 0.0;
            (pdVar17->p).x = fVar23;
            (pdVar17->p).y = fVar24;
            (pdVar17->p).z = 0.0;
            (pdVar17->p).w = 1.0;
            (pdVar17->dpds).x = 1.0;
            (pdVar17->dpds).y = 0.0;
            (pdVar17->dpds).z = 0.0;
            *(undefined8 *)&(pdVar17->dpds).w = 0;
            (pdVar17->dpdt).y = 1.0;
            (pdVar17->dpdt).z = 0.0;
            (pdVar17->dpdt).w = 0.0;
            uVar19 = uVar19 + 1;
            pdVar17 = pdVar17 + 1;
          } while (uVar1 != uVar19);
        }
        uVar13 = uVar13 + 1;
        pdVar15 = pdVar15 + (int)uVar1;
      } while (uVar13 != slices + 2U);
      __ptr->vertexv = pdVar4;
      __ptr->vertexc = uVar10;
    }
    uVar10 = stacks + 1;
    iVar7 = uVar10 * (slices + 1U);
    uVar3 = iVar7 * 6;
    uVar8 = iVar7 * 4;
    puVar5 = (uint16_t *)malloc((ulong)uVar3 * 2);
    puVar6 = (uint16_t *)malloc((ulong)uVar8 * 2);
    if (-1 < stacks) {
      uVar13 = (ulong)(slices + 1U);
      sVar2 = (short)stacks + 3;
      uVar19 = 0;
      do {
        if (-1 < slices) {
          psVar20 = (short *)((long)puVar5 + uVar19 * uVar13 * 0xc + 10);
          uVar14 = uVar19;
          uVar22 = uVar13;
          do {
            sVar16 = (short)uVar14;
            psVar20[-5] = sVar16;
            uVar11 = (int)uVar14 + uVar1;
            sVar9 = (short)uVar11;
            psVar20[-4] = sVar9;
            psVar20[-3] = sVar16 + 1;
            psVar20[-2] = sVar16 + 1;
            psVar20[-1] = sVar9;
            *psVar20 = sVar16 + sVar2;
            psVar20 = psVar20 + 6;
            uVar14 = (ulong)uVar11;
            uVar22 = uVar22 - 1;
          } while (uVar22 != 0);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar10);
      uVar19 = 0;
      do {
        if (-1 < slices) {
          uVar18 = uVar19 * uVar13 * 4;
          uVar14 = uVar19;
          uVar22 = uVar13;
          do {
            uVar21 = uVar18 & 0xffffffff;
            uVar12 = (uint16_t)uVar14;
            puVar6[uVar21] = uVar12;
            uVar11 = (int)uVar14 + uVar1;
            puVar6[uVar21 + 1] = (uint16_t)uVar11;
            puVar6[uVar21 + 2] = sVar2 + uVar12;
            puVar6[uVar21 + 3] = uVar12 + 1;
            uVar18 = uVar18 + 4;
            uVar14 = (ulong)uVar11;
            uVar22 = uVar22 - 1;
          } while (uVar22 != 0);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar10);
    }
    __ptr->poly3c = uVar3;
    __ptr->poly4c = uVar8;
    __ptr->poly3v = puVar5;
    __ptr->poly4v = puVar6;
  }
  else {
    fwrite("djg_error: Too many vertices\n",0x1d,1,_stdout);
    fflush(_stdout);
    free(__ptr);
    __ptr = (djg_mesh *)0x0;
  }
  return __ptr;
}

Assistant:

DJGDEF djg_mesh *
djgm_load_plane(int slices, int stacks)
{
    djg_mesh *mesh = djgm__create();

    DJG_ASSERT(slices >= 0 && stacks >= 0);
    if (!djgm__load_plane_vertices(mesh, slices, stacks)) {
        DJG_FREE(mesh);

        return NULL;
    }
    if (!djgm__load_plane_polygons(mesh, slices, stacks)) {
        DJG_FREE(mesh->vertexv);
        DJG_FREE(mesh);

        return NULL;
    }

    return mesh;
}